

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O1

bool __thiscall
gl3cts::TransformFeedback::CaptureVertexInterleaved::checkTransformFeedbackBuffer
          (CaptureVertexInterleaved *this,BindBufferCase bind_case,GLenum primitive_type)

{
  RenderContext *pRVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  long lVar7;
  undefined4 *puVar8;
  int iVar9;
  undefined4 in_register_00000034;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  long lVar14;
  long lVar6;
  
  pRVar1 = this->m_context->m_renderCtx;
  iVar4 = (*pRVar1->_vptr_RenderContext[3])(pRVar1,CONCAT44(in_register_00000034,bind_case));
  lVar6 = CONCAT44(extraout_var,iVar4);
  if (6 < primitive_type) {
    puVar8 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar8 = 0;
    __cxa_throw(puVar8,&int::typeinfo,0);
  }
  uVar2 = *(ulong *)(&DAT_01a45f68 + (ulong)primitive_type * 8);
  lVar7 = (**(code **)(lVar6 + 0xcf8))(0x8c8e,35000);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glMapBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0xa89);
  iVar4 = this->m_max_transform_feedback_components;
  bVar11 = true;
  iVar9 = 0;
  uVar10 = 0;
  do {
    if ((uVar2 <= uVar10) || (!bVar11)) break;
    bVar12 = bVar11;
    if (0 < iVar4 + -4) {
      lVar14 = 0;
      do {
        iVar13 = (int)lVar14;
        lVar14 = lVar14 + 1;
        bVar12 = false;
        if (0.125 < ABS(*(float *)(lVar7 + (ulong)(uint)(iVar9 + iVar13) * 4) - (float)iVar13))
        break;
        bVar12 = bVar11;
      } while (lVar14 < iVar4 + -4);
    }
    uVar10 = uVar10 + 1;
    iVar13 = iVar4 * (int)uVar10;
    bVar3 = false;
    bVar11 = false;
    if (ABS(ABS(*(float *)(lVar7 + (ulong)(iVar13 - 4) * 4)) + -1.0 + 0.0625) <= 0.125) {
      bVar3 = false;
      if (0.125 < ABS(ABS(*(float *)(lVar7 + (ulong)(iVar13 - 3) * 4)) + -1.0 + 0.0625)) {
        bVar11 = false;
      }
      else if ((ABS(*(float *)(lVar7 + (ulong)(iVar13 - 2) * 4)) <= 0.125) &&
              (bVar3 = false, ABS(*(float *)(lVar7 + (ulong)(iVar13 - 1) * 4) + -1.0) <= 0.125)) {
        bVar3 = true;
        bVar11 = bVar12;
      }
    }
    iVar9 = iVar9 + iVar4;
  } while (bVar3);
  (**(code **)(lVar6 + 0x1670))(0x8c8e);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glUnmapBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0xaad);
  return bVar11;
}

Assistant:

bool gl3cts::TransformFeedback::CaptureVertexInterleaved::checkTransformFeedbackBuffer(BindBufferCase bind_case UNUSED,
																					   glw::GLenum primitive_type)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Check */
	glw::GLuint number_of_vertices = 0;

	switch (primitive_type)
	{
	case GL_POINTS:
		number_of_vertices = 4;
		break;
	case GL_LINES:
		number_of_vertices = 4;
		break;
	case GL_LINE_LOOP:
		number_of_vertices = 8;
		break;
	case GL_LINE_STRIP:
		number_of_vertices = 6;
		break;
	case GL_TRIANGLES:
		number_of_vertices = 6;
		break;
	case GL_TRIANGLE_STRIP:
		number_of_vertices = 6;
		break;
	case GL_TRIANGLE_FAN:
		number_of_vertices = 6;
		break;
	default:
		throw 0;
	}

	glw::GLfloat* results = (glw::GLfloat*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer call failed.");

	bool is_ok = true;

	for (glw::GLuint j = 0; (j < number_of_vertices) && is_ok; ++j)
	{
		for (glw::GLint i = 0; i < m_max_transform_feedback_components - 4; ++i)
		{
			glw::GLfloat result	= results[i + j * m_max_transform_feedback_components];
			glw::GLfloat reference = (glw::GLfloat)(i);

			if (fabs(result - reference) > 0.125 /* precision */)
			{
				is_ok = false;

				break;
			}
		}

		/* gl_Position */
		glw::GLfloat result[4] = { results[(j + 1) * m_max_transform_feedback_components - 4],
								   results[(j + 1) * m_max_transform_feedback_components - 3],
								   results[(j + 1) * m_max_transform_feedback_components - 2],
								   results[(j + 1) * m_max_transform_feedback_components - 1] };

		if ((fabs(fabs(result[0]) - 1.0 + s_rasterization_epsilon) > 0.125 /* precision */) ||
			(fabs(fabs(result[1]) - 1.0 + s_rasterization_epsilon) > 0.125 /* precision */) ||
			(fabs(result[2]) > 0.125 /* precision */) || (fabs(result[3] - 1.0) > 0.125 /* precision */))
		{
			is_ok = false;

			break;
		}
	}

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer call failed.");

	return is_ok;
}